

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

iterator * __thiscall
density::heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::iterator
::operator++(iterator *this)

{
  void *pvVar1;
  QueueControl *i_control;
  
  i_control = (QueueControl *)(this->m_control->m_next & 0xfffffffffffffffc);
  while( true ) {
    if (this->m_queue->m_tail == i_control) {
      this->m_control = (ControlBlock *)0x0;
      return this;
    }
    if ((i_control->m_next & 3) == 0) break;
    i_control = (QueueControl *)(i_control->m_next & 0xfffffffffffffff8);
  }
  this->m_control = i_control;
  pvVar1 = heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
           get_element(i_control);
  (this->m_value).m_pair.m_address = pvVar1;
  (this->m_value).m_pair.m_type.m_feature_table = (tuple_type *)i_control[1].m_next;
  return this;
}

Assistant:

iterator & operator++() noexcept
            {
                DENSITY_ASSUME(m_queue != nullptr);
                m_control = m_queue->next_valid(m_control);
                if (m_control != nullptr)
                {
                    RUNTIME_TYPE & type = *type_after_control(m_control);
                    new (&m_value.m_pair) value_type(type, get_element(m_control));
                }
                return *this;
            }